

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O0

void CRenderTools::RenderEvalEnvelope
               (CEnvPoint *pPoints,int NumPoints,int Channels,float Time,float *pResult)

{
  float *in_RCX;
  int in_EDX;
  long lVar1;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  uint in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float ny;
  float fVar5;
  double dVar6;
  undefined4 in_XMM1_Db;
  float v1;
  float v0;
  int c_1;
  int c;
  float a;
  float Delta;
  int i;
  vec2 outTang;
  vec2 inTang;
  vec2 p3;
  vec2 p2;
  vec2 p1;
  vec2 p0;
  undefined4 in_stack_ffffffffffffff08;
  float p3_00;
  vector2_base<float> *this;
  int local_a4;
  int local_a0;
  float local_9c;
  int local_94;
  vector2_base<float> local_60;
  vector2_base<float> local_58;
  vector2_base<float> local_50;
  vector2_base<float> local_48;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_ffffffffffffffc0;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_ffffffffffffffc4;
  vector2_base<float> vVar7;
  anon_union_4_2_94730284_for_vector2_base<float>_1 x;
  vector2_base<float> vVar8;
  vector2_base<float> local_28;
  vector2_base<float> local_20;
  vector2_base<float> local_18;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    *in_RCX = 0.0;
    in_RCX[1] = 0.0;
    in_RCX[2] = 0.0;
    in_RCX[3] = 0.0;
  }
  else if (in_ESI == 1) {
    fVar2 = fx2f(*(int *)(in_RDI + 8));
    *in_RCX = fVar2;
    fVar2 = fx2f(*(int *)(in_RDI + 0xc));
    in_RCX[1] = fVar2;
    fVar2 = fx2f(*(int *)(in_RDI + 0x10));
    in_RCX[2] = fVar2;
    fVar2 = fx2f(*(int *)(in_RDI + 0x14));
    in_RCX[3] = fVar2;
  }
  else {
    dVar6 = std::fmod((double)(ulong)in_XMM0_Da,
                      (double)CONCAT44(in_XMM1_Db,
                                       (float)*(int *)(in_RDI + (long)(in_ESI + -1) * 0x58) / 1000.0
                                      ));
    fVar2 = SUB84(dVar6,0) * 1000.0;
    for (local_94 = 0; local_94 < in_ESI + -1; local_94 = local_94 + 1) {
      if (((float)*(int *)(in_RDI + (long)local_94 * 0x58) <= fVar2) &&
         (fVar2 <= (float)*(int *)(in_RDI + (long)(local_94 + 1) * 0x58))) {
        local_9c = (fVar2 - (float)*(int *)(in_RDI + (long)local_94 * 0x58)) /
                   (float)(*(int *)(in_RDI + (long)(local_94 + 1) * 0x58) -
                          *(int *)(in_RDI + (long)local_94 * 0x58));
        switch(*(undefined4 *)(in_RDI + 4 + (long)local_94 * 0x58)) {
        case 0:
          local_9c = 0.0;
          break;
        case 1:
          break;
        case 2:
          local_9c = local_9c * local_9c * local_9c;
          break;
        case 3:
          local_9c = 1.0 - local_9c;
          local_9c = -(local_9c * local_9c) * local_9c + 1.0;
          break;
        case 4:
          local_9c = local_9c * -2.0 * local_9c * local_9c + local_9c * 3.0 * local_9c;
          break;
        case 5:
          for (local_a0 = 0; local_a0 < in_EDX; local_a0 = local_a0 + 1) {
            vector2_base<float>::vector2_base(&local_10);
            vector2_base<float>::vector2_base(&local_18);
            vector2_base<float>::vector2_base(&local_20);
            vector2_base<float>::vector2_base(&local_28);
            vector2_base<float>::vector2_base((vector2_base<float> *)&stack0xffffffffffffffd0);
            vector2_base<float>::vector2_base((vector2_base<float> *)&stack0xffffffffffffffc8);
            p3_00 = 1000.0;
            fVar2 = (float)*(int *)(in_RDI + (long)local_94 * 0x58) / 1000.0;
            fVar5 = fx2f(*(int *)(in_RDI + (long)local_94 * 0x58 + 8 + (long)local_a0 * 4));
            vector2_base<float>::vector2_base
                      ((vector2_base<float> *)&stack0xffffffffffffffc0,fVar2,fVar5);
            lVar1 = (long)(local_94 + 1) * 0x58;
            fVar5 = (float)*(int *)(in_RDI + lVar1) / p3_00;
            fVar3 = fx2f(*(int *)(in_RDI + lVar1 + 8 + (long)local_a0 * 4));
            vector2_base<float>::vector2_base(&local_48,fVar5,fVar3);
            local_28 = local_48;
            lVar1 = in_RDI + (long)local_94 * 0x58;
            fVar3 = (float)*(int *)(lVar1 + 0x38 + (long)local_a0 * 4) / p3_00;
            fVar4 = fx2f(*(int *)(lVar1 + 0x48 + (long)local_a0 * 4));
            vector2_base<float>::vector2_base(&local_50,fVar3,fVar4);
            lVar1 = in_RDI + (long)(local_94 + 1) * 0x58;
            fVar4 = (float)*(int *)(lVar1 + 0x18 + (long)local_a0 * 4) / p3_00;
            vVar7 = local_50;
            ny = fx2f(*(int *)(lVar1 + 0x28 + (long)local_a0 * 4));
            this = &local_60;
            vector2_base<float>::vector2_base(this,fVar4,ny);
            local_58 = vector2_base<float>::operator-((vector2_base<float> *)CONCAT44(fVar3,fVar5));
            vVar8 = local_58;
            local_18 = vector2_base<float>::operator+
                                 (this,(vector2_base<float> *)CONCAT44(fVar4,p3_00));
            x = vVar8.field_0;
            local_20 = vector2_base<float>::operator-
                                 (this,(vector2_base<float> *)CONCAT44(fVar4,p3_00));
            ValidateFCurve(this,(vec2 *)CONCAT44(fVar4,p3_00),(vec2 *)CONCAT44(fVar3,fVar5),
                           (vec2 *)CONCAT44(fVar2,in_stack_ffffffffffffff08));
            fVar2 = SolveBezier(x.x,vVar7.field_1.y,vVar7.field_0.x,in_stack_ffffffffffffffc4.y,
                                in_stack_ffffffffffffffc0.x);
            clamp<float>(fVar2,0.0,1.0);
            fVar2 = bezier<float,float>((float)((ulong)this >> 0x20),SUB84(this,0),fVar4,p3_00,fVar3
                                       );
            in_RCX[local_a0] = fVar2;
          }
          goto LAB_001da6f7;
        }
        for (local_a4 = 0; local_a4 < in_EDX; local_a4 = local_a4 + 1) {
          fVar2 = fx2f(*(int *)(in_RDI + (long)local_94 * 0x58 + 8 + (long)local_a4 * 4));
          fVar5 = fx2f(*(int *)(in_RDI + (long)(local_94 + 1) * 0x58 + 8 + (long)local_a4 * 4));
          fVar2 = mix<float,float>(fVar2,fVar5,local_9c);
          in_RCX[local_a4] = fVar2;
        }
        goto LAB_001da6f7;
      }
    }
    fVar2 = fx2f(*(int *)(in_RDI + (long)(in_ESI + -1) * 0x58 + 8));
    *in_RCX = fVar2;
    fVar2 = fx2f(*(int *)(in_RDI + (long)(in_ESI + -1) * 0x58 + 0xc));
    in_RCX[1] = fVar2;
    fVar2 = fx2f(*(int *)(in_RDI + (long)(in_ESI + -1) * 0x58 + 0x10));
    in_RCX[2] = fVar2;
    fVar2 = fx2f(*(int *)(in_RDI + (long)(in_ESI + -1) * 0x58 + 0x14));
    in_RCX[3] = fVar2;
  }
LAB_001da6f7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CRenderTools::RenderEvalEnvelope(const CEnvPoint *pPoints, int NumPoints, int Channels, float Time, float *pResult)
{
	if(NumPoints == 0)
	{
		pResult[0] = 0;
		pResult[1] = 0;
		pResult[2] = 0;
		pResult[3] = 0;
		return;
	}

	if(NumPoints == 1)
	{
		pResult[0] = fx2f(pPoints[0].m_aValues[0]);
		pResult[1] = fx2f(pPoints[0].m_aValues[1]);
		pResult[2] = fx2f(pPoints[0].m_aValues[2]);
		pResult[3] = fx2f(pPoints[0].m_aValues[3]);
		return;
	}

	Time = fmod(Time, pPoints[NumPoints-1].m_Time/1000.0f)*1000.0f;

	for(int i = 0; i < NumPoints-1; i++)
	{
		if(Time >= pPoints[i].m_Time && Time <= pPoints[i+1].m_Time)
		{
			float Delta = pPoints[i+1].m_Time-pPoints[i].m_Time;
			float a = (Time-pPoints[i].m_Time)/Delta;

			switch(pPoints[i].m_Curvetype)
			{
			case CURVETYPE_STEP:
				a = 0;
				break;
			case CURVETYPE_SMOOTH:
				a = -2*a*a*a + 3*a*a; // second hermite basis
				break;
			case CURVETYPE_SLOW:
				a = a*a*a;
				break;
			case CURVETYPE_FAST:
				a = 1-a;
				a = 1-a*a*a;
				break;
			case CURVETYPE_BEZIER:
				for(int c = 0; c < Channels; c++)
				{
					// monotonic 2d cubic bezier curve
					vec2 p0, p1, p2, p3;
					vec2 inTang, outTang;

					p0 = vec2(pPoints[i].m_Time/1000.0f, fx2f(pPoints[i].m_aValues[c]));
					p3 = vec2(pPoints[i+1].m_Time/1000.0f, fx2f(pPoints[i+1].m_aValues[c]));

					outTang = vec2(pPoints[i].m_aOutTangentdx[c]/1000.0f, fx2f(pPoints[i].m_aOutTangentdy[c]));
					inTang = -vec2(pPoints[i+1].m_aInTangentdx[c]/1000.0f, fx2f(pPoints[i+1].m_aInTangentdy[c]));
					p1 = p0 + outTang;
					p2 = p3 - inTang;

					// validate bezier curve
					ValidateFCurve(p0, p1, p2, p3);

					// solve x(a) = time for a
					a = clamp(SolveBezier(Time/1000.0f, p0.x, p1.x, p2.x, p3.x), 0.0f, 1.0f);

					// value = y(t)
					pResult[c] =  bezier(p0.y, p1.y, p2.y, p3.y, a);
				}
				return;
			case CURVETYPE_LINEAR:
				break;
			}

			for(int c = 0; c < Channels; c++)
			{
				float v0 = fx2f(pPoints[i].m_aValues[c]);
				float v1 = fx2f(pPoints[i+1].m_aValues[c]);
				pResult[c] = mix(v0, v1, a);
			}

			return;
		}
	}

	pResult[0] = fx2f(pPoints[NumPoints-1].m_aValues[0]);
	pResult[1] = fx2f(pPoints[NumPoints-1].m_aValues[1]);
	pResult[2] = fx2f(pPoints[NumPoints-1].m_aValues[2]);
	pResult[3] = fx2f(pPoints[NumPoints-1].m_aValues[3]);
	return;
}